

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O2

void ngx_http_upstream_process_non_buffered_downstream(ngx_http_request_t *r)

{
  ngx_connection_t *c;
  ngx_http_upstream_t *u;
  ngx_event_t *pnVar1;
  ngx_log_t *log;
  
  c = r->connection;
  u = r->upstream;
  pnVar1 = c->write;
  log = c->log;
  if ((log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,log,0,"http upstream process non buffered downstream");
    log = c->log;
  }
  log->action = "sending to client";
  if ((pnVar1->field_0x9 & 4) == 0) {
    ngx_http_upstream_process_non_buffered_request(r,1);
    return;
  }
  c->field_0xd9 = c->field_0xd9 | 8;
  ngx_connection_error(c,0x6e,"client timed out");
  ngx_http_upstream_finalize_request(r,u,0x198);
  return;
}

Assistant:

static void
ngx_http_upstream_process_non_buffered_downstream(ngx_http_request_t *r)
{
    ngx_event_t          *wev;
    ngx_connection_t     *c;
    ngx_http_upstream_t  *u;

    c = r->connection;
    u = r->upstream;
    wev = c->write;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http upstream process non buffered downstream");

    c->log->action = "sending to client";

    if (wev->timedout) {
        c->timedout = 1;
        ngx_connection_error(c, NGX_ETIMEDOUT, "client timed out");
        ngx_http_upstream_finalize_request(r, u, NGX_HTTP_REQUEST_TIME_OUT);
        return;
    }

    ngx_http_upstream_process_non_buffered_request(r, 1);
}